

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::g1(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  float fVar1;
  float extraout_XMM0_Da;
  float_t fVar2;
  float fVar3;
  vec3 vVar4;
  
  fVar2 = 0.0;
  if (0.0 < wm->z) {
    fVar1 = 0.0;
    if (0.0 <= wi->z) {
      fVar1 = wi->z;
    }
    fVar3 = 1.0;
    if (fVar1 <= 1.0) {
      fVar3 = fVar1;
    }
    vVar4 = djb::operator*(&args->minv,wi);
    fVar1 = vVar4.z * vVar4.z + vVar4.x * vVar4.x + vVar4.y * vVar4.y;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    (*(this->super_brdf)._vptr_brdf[10])(this);
    fVar2 = fVar3 / (extraout_XMM0_Da * fVar1);
  }
  return fVar2;
}

Assistant:

float_t
microfacet::g1(const vec3 &wm, const vec3 &wi, const args &args) const
{
	if (wm.z > 0)
		return sat(wi.z) / sigma(wi, args);
	return 0;
}